

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&>
          (String *__return_storage_ptr__,kj *this,TestEnum_9c8e9318b29d9cd3 *params)

{
  kj *this_00;
  TestEnum_9c8e9318b29d9cd3 *value;
  String local_30;
  kj *local_18;
  TestEnum_9c8e9318b29d9cd3 *params_local;
  
  local_18 = this;
  params_local = (TestEnum_9c8e9318b29d9cd3 *)__return_storage_ptr__;
  this_00 = (kj *)fwd<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&>
                            ((TestEnum_9c8e9318b29d9cd3 *)this);
  toCharSequence<capnp::schemas::TestEnum_9c8e9318b29d9cd3_const&>(&local_30,this_00,value);
  _::concat(__return_storage_ptr__,&local_30);
  String::~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}